

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryActive
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  data;
  GLenum GVar1;
  deBool dVar2;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *this_00;
  Pipeline *this_01;
  ProgramPipeline *pPVar3;
  ProgramWrapper *pPVar4;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  SeparateShaderTest *this_03;
  bool bVar6;
  double __x;
  Pipeline *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  ResultCollector *this_04;
  allocator<char> local_231;
  string local_230;
  MessageBuilder local_210;
  allocator<char> local_89;
  string local_88;
  deUint32 local_68;
  deUint32 local_64;
  GLint queryActive;
  GLuint newActive;
  GLuint pipeName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  local_50;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *local_40;
  Pipeline *local_30;
  Pipeline *pipeline;
  ProgramParams pipePp;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *pipeOut_local;
  SeparateShaderTest *this_local;
  
  pipePp._8_8_ = pipeOut;
  _pipeline = genProgramParams(&this->m_rnd);
  this_03 = this;
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_50,this,(ProgramParams *)&pipeline);
  local_40 = de::details::MovePtr::operator_cast_to_PtrData(&local_50,(MovePtr *)this_03);
  data._8_8_ = in_stack_fffffffffffffd50;
  data.ptr = in_stack_fffffffffffffd48;
  this_00 = &de::details::
             MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
             ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                          *)pipePp._8_8_,data)->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ;
  this_01 = de::details::
            UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
            ::operator*(this_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
              *)&local_50);
  local_30 = this_01;
  pPVar3 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
           ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)this_01);
  queryActive = glu::ProgramPipeline::getPipeline(pPVar3);
  pPVar4 = Pipeline::getVertexProgram(local_30);
  local_64 = (*pPVar4->_vptr_ProgramWrapper[2])();
  local_68 = 0;
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    do {
      glu::CallLogWrapper::glGetProgramPipelineiv
                (&this->super_CallLogWrapper,queryActive,0x8259,(GLint *)&local_68);
      GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar1,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                      ,0x5ca);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  bVar6 = local_68 == 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Program pipeline query reported non-zero initial active program",
             &local_89);
  tcu::ResultCollector::check(&this->m_status,bVar6,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pPVar3 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
           ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_30);
  glu::ProgramPipeline::activeShaderProgram(pPVar3,local_64);
  log(this,__x);
  tcu::TestLog::operator<<(&local_210,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [14])"Set pipeline ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)&queryActive);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])"\'s active shader program to ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_64);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_210);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    do {
      glu::CallLogWrapper::glGetProgramPipelineiv
                (&this->super_CallLogWrapper,queryActive,0x8259,(GLint *)&local_68);
      GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar1,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                      ,0x5d3);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  this_04 = &this->m_status;
  bVar6 = local_68 == local_64;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Program pipeline query reported incorrect active program",
             &local_231);
  tcu::ResultCollector::check(this_04,bVar6,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pPVar3 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
           ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_30);
  glu::ProgramPipeline::activeShaderProgram(pPVar3,0);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryActive (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLuint						newActive	= pipeline.getVertexProgram().getProgramName();
	GLint						queryActive	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(queryActive == 0,
				   "Program pipeline query reported non-zero initial active program");

	pipeline.pipeline->activeShaderProgram(newActive);
	log() << TestLog::Message
		  << "Set pipeline " << pipeName << "'s active shader program to " << newActive
		  << TestLog::EndMessage;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(GLuint(queryActive) == newActive,
				   "Program pipeline query reported incorrect active program");

	pipeline.pipeline->activeShaderProgram(0);
}